

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSynchStateController::DecrementOwnershipCount(CSynchStateController *this)

{
  uint uVar1;
  OwnershipSemantics OVar2;
  DWORD DVar3;
  CPalThread *pCVar4;
  CPalSynchronizationManager *this_00;
  OwnedObjectsListNode *pooln_00;
  OwnedObjectsListNode *pooln;
  CPalSynchronizationManager *pSynchManager;
  LONG lOwnershipCount;
  PAL_ERROR palErr;
  CSynchStateController *this_local;
  
  pSynchManager._4_4_ = 0;
  uVar1 = CSynchData::GetOwnershipCount((this->super_CSynchControllerBase).m_psdSynchData);
  pCVar4 = InternalGetCurrentThread();
  if (pCVar4 != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","DecrementOwnershipCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x2a4);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
  }
  OVar2 = CObjectType::GetOwnershipSemantics((this->super_CSynchControllerBase).m_potObjectType);
  if (OVar2 != OwnershipTracked) {
    fprintf(_stderr,"] %s %s:%d","DecrementOwnershipCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x2a8);
    fprintf(_stderr,
            "Expression: CObjectType::OwnershipTracked == m_potObjectType->GetOwnershipSemantics(), Description: Trying to decrement ownership count on an object with ownership semantics other than OwnershipTracked\n"
           );
  }
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"] %s %s:%d","DecrementOwnershipCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x2ac);
    fprintf(_stderr,
            "Expression: 0 <= lOwnershipCount, Description: Operation would make ownership count negative - object should be owned at this time [ownership count=%d]\n"
            ,(ulong)uVar1);
  }
  if ((((int)uVar1 < 1) ||
      (DVar3 = CSynchData::GetOwnerProcessID((this->super_CSynchControllerBase).m_psdSynchData),
      DVar3 != gPID)) ||
     (pCVar4 = CSynchData::GetOwnerThread((this->super_CSynchControllerBase).m_psdSynchData),
     pCVar4 != (this->super_CSynchControllerBase).m_pthrOwner)) {
    pSynchManager._4_4_ = 0x120;
  }
  else {
    CSynchData::SetOwnershipCount((this->super_CSynchControllerBase).m_psdSynchData,uVar1 - 1);
    if (uVar1 - 1 == 0) {
      this_00 = CPalSynchronizationManager::GetInstance();
      pooln_00 = CSynchData::GetOwnershipListNode((this->super_CSynchControllerBase).m_psdSynchData)
      ;
      if (pooln_00 == (OwnedObjectsListNode *)0x0) {
        fprintf(_stderr,"] %s %s:%d","DecrementOwnershipCount",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x2c2);
        fprintf(_stderr,
                "Expression: NULL != pooln, Description: Null ownership node pointer in SynchData with ownership semantics\n"
               );
      }
      if ((this->super_CSynchControllerBase).m_psdSynchData != pooln_00->pPalObjSynchData) {
        fprintf(_stderr,"] %s %s:%d","DecrementOwnershipCount",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x2c4);
        fprintf(_stderr,
                "Expression: m_psdSynchData == pooln->pPalObjSynchData, Description: Corrupted ownership node\n"
               );
      }
      CThreadSynchronizationInfo::RemoveObjectFromOwnedList
                (&((this->super_CSynchControllerBase).m_pthrOwner)->synchronizationInfo,pooln_00);
      CSynchData::Release((this->super_CSynchControllerBase).m_psdSynchData,
                          (this->super_CSynchControllerBase).m_pthrOwner);
      CPalSynchronizationManager::CacheAddOwnedObjsListNode
                (this_00,(this->super_CSynchControllerBase).m_pthrOwner,pooln_00);
      CSynchData::ResetOwnership((this->super_CSynchControllerBase).m_psdSynchData);
      CSynchData::Signal((this->super_CSynchControllerBase).m_psdSynchData,
                         (this->super_CSynchControllerBase).m_pthrOwner,1,false);
    }
  }
  return pSynchManager._4_4_;
}

Assistant:

PAL_ERROR CSynchStateController::DecrementOwnershipCount()
    {
        VALIDATEOBJECT(m_psdSynchData);
        
        PAL_ERROR palErr = NO_ERROR;
        LONG lOwnershipCount = m_psdSynchData->GetOwnershipCount();

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        _ASSERT_MSG(CObjectType::OwnershipTracked == 
                    m_potObjectType->GetOwnershipSemantics(),
                    "Trying to decrement ownership count on an object with "
                    "ownership semantics other than OwnershipTracked\n");
        _ASSERT_MSG(0 <= lOwnershipCount,
                    "Operation would make ownership count negative - object "
                    "should be owned at this time [ownership count=%d]\n", 
                    lOwnershipCount);
        
        if ( (1 > lOwnershipCount) || 
             (m_psdSynchData->GetOwnerProcessID() != gPID) ||
             (m_psdSynchData->GetOwnerThread() != m_pthrOwner) )
        {
            palErr = ERROR_NOT_OWNER;
            goto DOC_exit;            
        }

        lOwnershipCount--;
        m_psdSynchData->SetOwnershipCount(lOwnershipCount);

        if (0 == lOwnershipCount)
        {
            CPalSynchronizationManager * pSynchManager = 
                CPalSynchronizationManager::GetInstance();
            OwnedObjectsListNode * pooln =
                m_psdSynchData->GetOwnershipListNode();

            _ASSERT_MSG(NULL != pooln, 
                        "Null ownership node pointer in SynchData with ownership "
                        "semantics\n");
            _ASSERT_MSG(m_psdSynchData == pooln->pPalObjSynchData, 
                        "Corrupted ownership node\n");

            // Object has been released
            // Remove it from list of owned objs for current thread
            m_pthrOwner->synchronizationInfo.RemoveObjectFromOwnedList(pooln);

            // Release SynchData reference count implied by the ownership 
            // list node
            m_psdSynchData->Release(m_pthrOwner);

            // Return node to the cache
            pSynchManager->CacheAddOwnedObjsListNode(m_pthrOwner, pooln);

            // Reset ownership
            m_psdSynchData->ResetOwnership();             
            
            // Signal it and trigger waiter thread awakening
            m_psdSynchData->Signal(m_pthrOwner, 1, false);
        }
                
    DOC_exit:
        return palErr;
    }